

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Firework.cpp
# Opt level: O1

void __thiscall Firework::displayStreamer(Firework *this,Screen *screen)

{
  Screen *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  image;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  
  local_28.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_28,&this->ball);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_28,&this->stream);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_28,&this->tail);
  this_00 = screen;
  Screen::turnAttrOn(screen,(this->streamerColor & 0xffU) << 8);
  if (this->currentPosition[0] == this->endPosition[0]) {
    this->fireworkStage = 2;
  }
  else {
    printImage((Firework *)this_00,screen,this->currentPosition,&local_28);
    if (this->streamFrameCounter == 0) {
      this->currentPosition[0] = this->currentPosition[0] + -1;
      this->streamFrameCounter = 1;
    }
    else {
      this->streamFrameCounter = this->streamFrameCounter + -1;
    }
  }
  Screen::turnAttrOff(screen,(this->streamerColor & 0xffU) << 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_28);
  return;
}

Assistant:

void Firework::displayStreamer(Screen &screen) {
    std::vector<std::string> image;


    // Create the streaming ball image
    image.push_back(ball);
    image.push_back(stream);
    image.push_back(tail);

    screen.turnAttrOn(COLOR_PAIR(streamerColor));

    // Loop through the animation until streamer is in the final position
    if(currentPosition[0] != endPosition[0]){
        printImage(screen, currentPosition, image);

        if(streamFrameCounter == 0){
            currentPosition[0] -= 1;
            streamFrameCounter = 1;
        }
        else {
            streamFrameCounter--;
        }
    }
    else{
        fireworkStage = EXPLOSION_STAGE;
    }

    screen.turnAttrOff(COLOR_PAIR(streamerColor));
}